

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O0

void __thiscall
de::cmdline::detail::TypedFieldMap::set(TypedFieldMap *this,type_info *key,Entry *value)

{
  DestroyFunc p_Var1;
  iterator iVar2;
  bool bVar3;
  pointer ppVar4;
  pair<const_std::type_info_*,_de::cmdline::detail::TypedFieldMap::Entry> local_48;
  _Self local_30;
  _Self local_28;
  iterator pos;
  Entry *value_local;
  type_info *key_local;
  TypedFieldMap *this_local;
  
  pos._M_node = (_Base_ptr)value;
  value_local = (Entry *)key;
  key_local = (type_info *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_std::type_info_*,_de::cmdline::detail::TypedFieldMap::Entry,_std::less<const_std::type_info_*>,_std::allocator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>_>
       ::find(&this->m_fields,(key_type *)&value_local);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_std::type_info_*,_de::cmdline::detail::TypedFieldMap::Entry,_std::less<const_std::type_info_*>,_std::allocator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>_>
       ::end(&this->m_fields);
  bVar3 = std::operator!=(&local_28,&local_30);
  if (bVar3) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>
             ::operator->(&local_28);
    p_Var1 = (ppVar4->second).destructor;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>
             ::operator->(&local_28);
    (*p_Var1)((ppVar4->second).value);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>
             ::operator->(&local_28);
    iVar2 = pos;
    (ppVar4->second).value = (void *)0x0;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>
             ::operator->(&local_28);
    (ppVar4->second).value = *(void **)iVar2._M_node;
    (ppVar4->second).destructor = (DestroyFunc)(iVar2._M_node)->_M_parent;
  }
  else {
    std::make_pair<std::type_info_const*&,de::cmdline::detail::TypedFieldMap::Entry_const&>
              (&local_48,(type_info **)&value_local,(Entry *)pos._M_node);
    std::
    map<std::type_info_const*,de::cmdline::detail::TypedFieldMap::Entry,std::less<std::type_info_const*>,std::allocator<std::pair<std::type_info_const*const,de::cmdline::detail::TypedFieldMap::Entry>>>
    ::insert<std::pair<std::type_info_const*,de::cmdline::detail::TypedFieldMap::Entry>>
              ((map<std::type_info_const*,de::cmdline::detail::TypedFieldMap::Entry,std::less<std::type_info_const*>,std::allocator<std::pair<std::type_info_const*const,de::cmdline::detail::TypedFieldMap::Entry>>>
                *)this,&local_48);
  }
  return;
}

Assistant:

void TypedFieldMap::set (const std::type_info* key, const Entry& value)
{
	Map::iterator pos = m_fields.find(key);

	if (pos != m_fields.end())
	{
		pos->second.destructor(pos->second.value);
		pos->second.value = DE_NULL;

		pos->second = value;
	}
	else
		m_fields.insert(std::make_pair(key, value));
}